

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_scroll_to_selection(Terminal *term,wchar_t which_end)

{
  wchar_t wVar1;
  wchar_t local_20;
  wchar_t sbtop;
  wchar_t y;
  pos target;
  wchar_t which_end_local;
  Terminal *term_local;
  
  local_20 = sblines(term);
  local_20 = -local_20;
  if (term->selstate == SEEN_OSC) {
    if (which_end == L'\0') {
      sbtop = (term->selstart).y;
    }
    else {
      sbtop = (term->selend).y;
    }
    wVar1 = sbtop - term->rows / 2;
    if ((local_20 <= wVar1) && (local_20 = wVar1, L'\0' < wVar1)) {
      local_20 = L'\0';
    }
    term_scroll(term,L'\xffffffff',local_20);
  }
  return;
}

Assistant:

void term_scroll_to_selection(Terminal *term, int which_end)
{
    pos target;
    int y;
    int sbtop = -sblines(term);

    if (term->selstate != SELECTED)
        return;
    if (which_end)
        target = term->selend;
    else
        target = term->selstart;

    y = target.y - term->rows/2;
    if (y < sbtop)
        y = sbtop;
    else if (y > 0)
        y = 0;
    term_scroll(term, -1, y);
}